

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::StringAppend(VirtualMachine *this)

{
  element_type *peVar1;
  anon_union_8_6_52c89740_for_Variable_1 aVar2;
  Variable VVar3;
  Variable VVar4;
  Variable var;
  string local_58;
  VariableType local_34;
  
  VVar3 = popOpStack(this);
  local_34 = VVar3.type;
  VVar4 = popOpStack(this);
  aVar2.stringValue = Heap::NewString_abi_cxx11_(&this->heap);
  ((aVar2.objectValue)->properties)._M_h._M_bucket_count = 0;
  *(char *)((aVar2.objectValue)->properties)._M_h._M_buckets = '\0';
  var._4_4_ = 0;
  var.type = VVar4.type;
  var.field_1.integerValue = VVar4.field_1.integerValue;
  variableToString_abi_cxx11_(&local_58,this,var,true);
  std::__cxx11::string::_M_append((char *)aVar2.objectValue,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  VVar4._4_4_ = 0;
  VVar4.type = local_34;
  VVar4.field_1.integerValue = VVar3.field_1.integerValue;
  variableToString_abi_cxx11_(&local_58,this,VVar4,true);
  std::__cxx11::string::_M_append((char *)aVar2.objectValue,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  VVar3.field_1.integerValue = aVar2.integerValue;
  VVar3._0_8_ = 4;
  pushOpStack(this,VVar3);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::StringAppend() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  auto str = this->heap.NewString();

  str->clear();

  str->append(this->variableToString(first, true));
  str->append(this->variableToString(second, true));

  this->pushString(str);
  this->advance();
}